

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::test_tracked_vector::test_method(test_tracked_vector *this)

{
  long lVar1;
  pointer pTVar2;
  pointer pTVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator pvVar5;
  iterator in_R9;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *pvVar6;
  int *piVar7;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *pvVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  check_type cVar15;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *pvVar9;
  undefined8 *puVar10;
  char **ppcVar11;
  pointer pTVar12;
  pointer pTVar13;
  pointer pTVar14;
  char *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  undefined1 *local_b70;
  undefined1 *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  assertion_result local_ad0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  undefined1 *local_a88;
  undefined1 *local_a80;
  char *local_a78;
  char *local_a70;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_a68;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v8;
  undefined1 *local_8d8;
  undefined1 *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  undefined1 *local_8a8;
  undefined1 *local_8a0;
  char *local_898;
  char *local_890;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_888;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v7;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_708;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v6;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  local_528;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v5;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v4;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v3;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v2;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  lazy_ostream local_c8;
  undefined1 *local_b8;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *local_b0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  v1;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  Tracker t3;
  Tracker t2;
  Tracker t1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t1.copies = 0;
  t2.copies = 0;
  t3.origin = &t3;
  t3.copies = 0;
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x5f8;
  file.m_begin = (iterator)&local_78;
  t2.origin = &t2;
  t1.origin = &t1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v1.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,t1.origin == &t1);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140bf88;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fb3a;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v1,&local_c8,1,0,WARN,_cVar15,(size_t)&local_d8,0x5f8);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v1.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x5f9;
  file_00.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f8,msg_00
            );
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v1.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,t2.origin == &t2);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140bf95;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fb4b;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v1,&local_c8,1,0,WARN,_cVar15,(size_t)&local_108,0x5f9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v1.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x5fa;
  file_01.m_begin = (iterator)&local_118;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_128,
             msg_01);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v1.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,t3.origin == &t3);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140bfa2;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fb5c;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_130 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v1,&local_c8,1,0,WARN,_cVar15,(size_t)&local_138,0x5fa);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v1.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v1,1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
              *)&v1,&t1);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x5fd;
  file_02.m_begin = (iterator)&local_148;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_158,
             msg_02);
  pTVar3 = v1.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_160 = "";
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v1.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v1.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar8 = &v2;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v3.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  pvVar6 = &v3;
  pTVar13 = v1.
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            ._M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_168,0x5fd,1,2,pvVar8,"v1.size()",&v3,"1U");
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pvVar8;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x5fe;
  file_03.m_begin = (iterator)&local_178;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_188,
             msg_03);
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v2.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar13->origin == &t1);
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140bfbc;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fb7a;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v2,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_1b8,0x5fe)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v2.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x5ff;
  file_04.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d8,
             msg_04);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e0 = "";
  piVar7 = &pTVar13->copies;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v2.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_1e8,0x5ff,1,2,piVar7,"v1[0].copies",(assertion_result *)&v2,"1");
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v2,1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v2,&t2);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)piVar7;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x602;
  file_05.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_208,
             msg_05);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_210 = "";
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v2.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v2.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar8 = &v3;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v4.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  pvVar6 = &v4;
  pTVar12 = v2.
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar14 = v2.
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_218,0x602,1,2,pvVar8,"v2.size()",&v4,"1U",
             v2.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_start,pTVar13,
             v2.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pvVar8;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x603;
  file_06.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_238,
             msg_06);
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v3.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar12->origin == &t2);
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140bfe3;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fba5;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_260 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v3,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_268,0x603)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v3.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  file_07.m_end = (iterator)0x604;
  file_07.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_288,
             msg_07);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_290 = "";
  piVar7 = &pTVar12->copies;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)v3.
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_298,0x604,1,2,piVar7,"v2[0].copies",(assertion_result *)&v3,"0");
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v3.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v3,2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
              *)&v3,&t1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v3,&t2);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)piVar7;
  msg_08.m_begin = pvVar4;
  file_08.m_end = (iterator)0x607;
  file_08.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2b8,
             msg_08);
  pTVar2 = v3.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2c0 = "";
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v3.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v3.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar8 = &v4;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar4 = (iterator)0x2;
  pvVar6 = &v5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_2c8,0x607,1,2,pvVar8,"v3.size()",&v5,"2U");
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pvVar8;
  msg_09.m_begin = pvVar4;
  file_09.m_end = (iterator)0x608;
  file_09.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2e8,
             msg_09);
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v4.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2->origin == &t1);
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c017;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fbd0;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_310 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v4,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_318,0x608)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v4.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  file_10.m_end = (iterator)0x609;
  file_10.m_begin = (iterator)&local_328;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_338,
             msg_10);
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v4.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[1].origin == &t2);
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c024;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fbe4;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_340 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v4,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_348,0x609)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v4.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  file_11.m_end = (iterator)0x60a;
  file_11.m_begin = (iterator)&local_358;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_368,
             msg_11);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_370 = "";
  piVar7 = &pTVar2->copies;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v4.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_378,0x60a,1,2,piVar7,"v3[0].copies",(assertion_result *)&v4,"1");
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)piVar7;
  msg_12.m_begin = pvVar4;
  file_12.m_end = (iterator)0x60b;
  file_12.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_398,
             msg_12);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3a0 = "";
  piVar7 = &pTVar2[1].copies;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)v4.
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_3a8,0x60b,1,2,piVar7,"v3[1].copies",(assertion_result *)&v4,"0");
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v4.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(&v4,3);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v4,pTVar2);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
              *)&v4,pTVar2 + 1);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>(&v4,&t3);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)piVar7;
  msg_13.m_begin = pvVar4;
  file_13.m_end = (iterator)0x60e;
  file_13.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3c8,
             msg_13);
  pTVar2 = v4.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3d0 = "";
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v4.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v4.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar8 = &v5;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  pvVar4 = (iterator)0x2;
  pvVar6 = &v6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_3d8,0x60e,1,2,pvVar8,"v4.size()",&v6,"3U");
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pvVar8;
  msg_14.m_begin = pvVar4;
  file_14.m_end = (iterator)0x60f;
  file_14.m_begin = (iterator)&local_3e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3f8,
             msg_14);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2->origin == &t1);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c058;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fc1c;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_418 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v5,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_420,0x60f)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v5.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  file_15.m_end = (iterator)0x610;
  file_15.m_begin = (iterator)&local_430;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_440,
             msg_15);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[1].origin == &t2);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c065;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fc30;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_448 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v5,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_450,0x610)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v5.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_460 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  file_16.m_end = (iterator)0x611;
  file_16.m_begin = (iterator)&local_460;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_470,
             msg_16);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[2].origin == &t3);
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c072;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fc44;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_478 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v5,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_480,0x611)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v5.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  file_17.m_end = (iterator)0x612;
  file_17.m_begin = (iterator)&local_490;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4a0,
             msg_17);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4a8 = "";
  piVar7 = &pTVar2->copies;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_4b0,0x612,1,2,piVar7,"v4[0].copies",(assertion_result *)&v5,"1");
  local_4c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = (iterator)piVar7;
  msg_18.m_begin = pvVar4;
  file_18.m_end = (iterator)0x613;
  file_18.m_begin = (iterator)&local_4c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4d0,
             msg_18);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4d8 = "";
  piVar7 = &pTVar2[1].copies;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v5.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_4e0,0x613,1,2,piVar7,"v4[1].copies",(assertion_result *)&v5,"1");
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)piVar7;
  msg_19.m_begin = pvVar4;
  file_19.m_end = (iterator)0x614;
  file_19.m_begin = (iterator)&local_4f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_500,
             msg_19);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_508 = "";
  piVar7 = &pTVar2[2].copies;
  v5.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)v5.
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_510,0x614,1,2,piVar7,"v4[2].copies",(assertion_result *)&v5,"0");
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)&local_528,&v1);
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (&v5,(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)&local_528,&v4);
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&local_528);
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = (iterator)piVar7;
  msg_20.m_begin = pvVar4;
  file_20.m_end = (iterator)0x617;
  file_20.m_begin = (iterator)&local_538;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_548,
             msg_20);
  pTVar2 = v5.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_558 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_550 = "";
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v5.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v5.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar8 = &v6;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  pvVar4 = (iterator)0x2;
  pvVar6 = &v7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_558,0x617,1,2,pvVar8,"v5.size()",&v7,"4U");
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)pvVar8;
  msg_21.m_begin = pvVar4;
  file_21.m_end = (iterator)0x618;
  file_21.m_begin = (iterator)&local_568;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_578,
             msg_21);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2->origin == &t1);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c0b3;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fc89;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_598 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v6,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_5a0,0x618)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  file_22.m_end = (iterator)0x619;
  file_22.m_begin = (iterator)&local_5b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5c0,
             msg_22);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[1].origin == &t1);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c0c0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fc9d;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5c8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v6,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_5d0,0x619)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  file_23.m_end = (iterator)0x61a;
  file_23.m_begin = (iterator)&local_5e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5f0,
             msg_23);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[2].origin == &t2);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c0cd;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fcb1;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v6,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_600,0x61a)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar5;
  msg_24.m_begin = pvVar4;
  file_24.m_end = (iterator)0x61b;
  file_24.m_begin = (iterator)&local_610;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_620,
             msg_24);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[3].origin == &t3);
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c0da;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fcc5;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_628 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v7;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v6,&local_c8,1,0,WARN,(check_type)pvVar6,(size_t)&local_630,0x61b)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v6.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar5;
  msg_25.m_begin = pvVar4;
  file_25.m_end = (iterator)0x61c;
  file_25.m_begin = (iterator)&local_640;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_650,
             msg_25);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_658 = "";
  piVar7 = &pTVar2->copies;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_660,0x61c,1,2,piVar7,"v5[0].copies",(assertion_result *)&v6,"2");
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_668 = "";
  local_680 = &boost::unit_test::basic_cstring<char_const>::null;
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = (iterator)piVar7;
  msg_26.m_begin = pvVar4;
  file_26.m_end = (iterator)0x61d;
  file_26.m_begin = (iterator)&local_670;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_680,
             msg_26);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_688 = "";
  piVar7 = &pTVar2[1].copies;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_690,0x61d,1,2,piVar7,"v5[1].copies",(assertion_result *)&v6,"2");
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = (iterator)piVar7;
  msg_27.m_begin = pvVar4;
  file_27.m_end = (iterator)0x61e;
  file_27.m_begin = (iterator)&local_6a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6b0,
             msg_27);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6b8 = "";
  piVar7 = &pTVar2[2].copies;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_6c0,0x61e,1,2,piVar7,"v5[2].copies",(assertion_result *)&v6,"2");
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = (iterator)piVar7;
  msg_28.m_begin = pvVar4;
  file_28.m_end = (iterator)0x61f;
  file_28.m_begin = (iterator)&local_6d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_6e0,
             msg_28);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6e8 = "";
  piVar7 = &pTVar2[3].copies;
  v6.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v6.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_6f0,0x61f,1,2,piVar7,"v5[3].copies",(assertion_result *)&v6,"1");
  local_708._M_impl.super__Vector_impl_data._M_finish = pTVar3;
  local_708._M_impl.super__Vector_impl_data._M_end_of_storage =
       v1.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v1.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = &v6;
  local_708._M_impl.super__Vector_impl_data._M_start = pTVar13;
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (pvVar8,(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                     *)&local_708,&v3);
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&local_708);
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = (iterator)piVar7;
  msg_29.m_begin = pvVar4;
  file_29.m_end = (iterator)0x622;
  file_29.m_begin = (iterator)&local_718;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_728,
             msg_29);
  pTVar2 = v6.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_730 = "";
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v6.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v6.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar6 = &v7;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  pvVar4 = (iterator)0x2;
  pvVar9 = &v8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_738,0x622,1,2,pvVar6,"v6.size()",&v8,"3U",pTVar12,pvVar8);
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = (iterator)pvVar6;
  msg_30.m_begin = pvVar4;
  file_30.m_end = (iterator)0x623;
  file_30.m_begin = (iterator)&local_748;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_758,
             msg_30);
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2->origin == &t1);
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c128;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fd17;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_778 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v7,&local_c8,1,0,WARN,(check_type)pvVar9,(size_t)&local_780,0x623)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v7.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar5;
  msg_31.m_begin = pvVar4;
  file_31.m_end = (iterator)0x624;
  file_31.m_begin = (iterator)&local_790;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7a0,
             msg_31);
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[1].origin == &t1);
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c135;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fd2b;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v7,&local_c8,1,0,WARN,(check_type)pvVar9,(size_t)&local_7b0,0x624)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v7.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar5;
  msg_32.m_begin = pvVar4;
  file_32.m_end = (iterator)0x625;
  file_32.m_begin = (iterator)&local_7c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_7d0,
             msg_32);
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[2].origin == &t2);
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_140c142;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xc6fd3f;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7d8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = &v8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v7,&local_c8,1,0,WARN,(check_type)pvVar9,(size_t)&local_7e0,0x625)
  ;
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v7.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar5;
  msg_33.m_begin = pvVar4;
  file_33.m_end = (iterator)0x626;
  file_33.m_begin = (iterator)&local_7f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_800,
             msg_33);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_808 = "";
  piVar7 = &pTVar2->copies;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_810,0x626,1,2,piVar7,"v6[0].copies",(assertion_result *)&v7,"1");
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = (iterator)piVar7;
  msg_34.m_begin = pvVar4;
  file_34.m_end = (iterator)0x627;
  file_34.m_begin = (iterator)&local_820;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_830,
             msg_34);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_838 = "";
  piVar7 = &pTVar2[1].copies;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_840,0x627,1,2,piVar7,"v6[1].copies",(assertion_result *)&v7,"2");
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = (iterator)piVar7;
  msg_35.m_begin = pvVar4;
  file_35.m_end = (iterator)0x628;
  file_35.m_begin = (iterator)&local_850;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_860,
             msg_35);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_868 = "";
  piVar7 = &pTVar2[2].copies;
  v7.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v7.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_870,0x628,1,2,piVar7,"v6[2].copies",(assertion_result *)&v7,"1");
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *)&local_888,&v2);
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (&v7,(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  *)&local_888,&v4);
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&local_888);
  local_898 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_890 = "";
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = (iterator)piVar7;
  msg_36.m_begin = pvVar4;
  file_36.m_end = (iterator)0x62b;
  file_36.m_begin = (iterator)&local_898;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_8a8,
             msg_36);
  pTVar2 = v7.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_8b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8b0 = "";
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)v7.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)v7.
                       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
  pvVar8 = &v8;
  local_ad0._0_4_ = 4;
  pvVar4 = (iterator)0x2;
  puVar10 = (undefined8 *)&local_ad0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_8b8,0x62b,1,2,pvVar8,"v7.size()",&local_ad0,"4U");
  local_8c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8c0 = "";
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = (iterator)pvVar8;
  msg_37.m_begin = pvVar4;
  file_37.m_end = (iterator)0x62c;
  file_37.m_begin = (iterator)&local_8c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8d8,
             msg_37);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2->origin == &t2);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad0._0_8_ = "v7[0].origin == &t2";
  local_ad0.m_message.px = (element_type *)0xc6fd84;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8f8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ad0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v8,&local_c8,1,0,WARN,(check_type)puVar10,(size_t)&local_900,0x62c
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v8.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = pvVar5;
  msg_38.m_begin = pvVar4;
  file_38.m_end = (iterator)0x62d;
  file_38.m_begin = (iterator)&local_910;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_920,
             msg_38);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[1].origin == &t1);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad0._0_8_ = "v7[1].origin == &t1";
  local_ad0.m_message.px = (element_type *)0xc6fd98;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_928 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ad0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v8,&local_c8,1,0,WARN,(check_type)puVar10,(size_t)&local_930,0x62d
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v8.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pvVar5;
  msg_39.m_begin = pvVar4;
  file_39.m_end = (iterator)0x62e;
  file_39.m_begin = (iterator)&local_940;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_950,
             msg_39);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[2].origin == &t2);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad0._0_8_ = "v7[2].origin == &t2";
  local_ad0.m_message.px = (element_type *)0xc6fdac;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_958 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ad0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v8,&local_c8,1,0,WARN,(check_type)puVar10,(size_t)&local_960,0x62e
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v8.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = pvVar5;
  msg_40.m_begin = pvVar4;
  file_40.m_end = (iterator)0x62f;
  file_40.m_begin = (iterator)&local_970;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_980,
             msg_40);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,pTVar2[3].origin == &t3);
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad0._0_8_ = "v7[3].origin == &t3";
  local_ad0.m_message.px = (element_type *)0xc6fdc0;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_988 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ad0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&v8,&local_c8,1,0,WARN,(check_type)puVar10,(size_t)&local_990,0x62f
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &v8.
              super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = pvVar5;
  msg_41.m_begin = pvVar4;
  file_41.m_end = (iterator)0x630;
  file_41.m_begin = (iterator)&local_9a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_9b0,
             msg_41);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9b8 = "";
  piVar7 = &pTVar2->copies;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_9c0,0x630,1,2,piVar7,"v7[0].copies",(assertion_result *)&v8,"1");
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = (iterator)piVar7;
  msg_42.m_begin = pvVar4;
  file_42.m_end = (iterator)0x631;
  file_42.m_begin = (iterator)&local_9d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_9e0,
             msg_42);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9e8 = "";
  piVar7 = &pTVar2[1].copies;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_9f0,0x631,1,2,piVar7,"v7[1].copies",(assertion_result *)&v8,"1");
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_43.m_end = (iterator)piVar7;
  msg_43.m_begin = pvVar4;
  file_43.m_end = (iterator)0x632;
  file_43.m_begin = (iterator)&local_a00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_a10,
             msg_43);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a18 = "";
  piVar7 = &pTVar2[2].copies;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(v8.
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_a20,0x632,1,2,piVar7,"v7[2].copies",(assertion_result *)&v8,"1");
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_44.m_end = (iterator)piVar7;
  msg_44.m_begin = pvVar4;
  file_44.m_end = (iterator)0x633;
  file_44.m_begin = (iterator)&local_a30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_a40,
             msg_44);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a48 = "";
  piVar7 = &pTVar2[3].copies;
  v8.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)v8.
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_a50,0x633,1,2,piVar7,"v7[3].copies",(assertion_result *)&v8,"0");
  local_a68._M_impl.super__Vector_impl_data._M_end_of_storage =
       v2.
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  v2.
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = &v8;
  local_a68._M_impl.super__Vector_impl_data._M_start = pTVar12;
  local_a68._M_impl.super__Vector_impl_data._M_finish = pTVar14;
  Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (pvVar8,(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                     *)&local_a68,&v3);
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&local_a68);
  local_a78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a70 = "";
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_45.m_end = (iterator)piVar7;
  msg_45.m_begin = pvVar4;
  file_45.m_end = (iterator)0x636;
  file_45.m_begin = (iterator)&local_a78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_a88,
             msg_45);
  pTVar2 = v8.
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_a98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a90 = "";
  local_ad0._0_8_ =
       (long)v8.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)v8.
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4;
  pvVar4 = (iterator)&local_ad0;
  local_ae0 = (char *)CONCAT44(local_ae0._4_4_,3);
  pvVar5 = (iterator)0x2;
  ppcVar11 = &local_ae0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_c8,&local_a98,0x636,1,2,pvVar4,"v8.size()",&local_ae0,"3U",pvVar8);
  local_aa8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_aa0 = "";
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = pvVar4;
  msg_46.m_begin = pvVar5;
  file_46.m_end = (iterator)0x637;
  file_46.m_begin = (iterator)&local_aa8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_ab8,
             msg_46);
  local_ad0.m_message.px = (element_type *)0x0;
  local_ad0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_ae0 = "v8[0].origin == &t2";
  local_ad8 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ae8 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ae0;
  local_ad0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar2->origin == &t2);
  boost::test_tools::tt_detail::report_assertion
            (&local_ad0,&local_c8,1,0,WARN,(check_type)ppcVar11,(size_t)&local_af0,0x637);
  boost::detail::shared_count::~shared_count(&local_ad0.m_message.pn);
  local_b00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_af8 = "";
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = pvVar5;
  msg_47.m_begin = pvVar4;
  file_47.m_end = (iterator)0x638;
  file_47.m_begin = (iterator)&local_b00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_b10,
             msg_47);
  local_ad0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pTVar2[1].origin == &t1);
  local_ad0.m_message.px = (element_type *)0x0;
  local_ad0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_ae0 = "v8[1].origin == &t1";
  local_ad8 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b18 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ae0;
  boost::test_tools::tt_detail::report_assertion
            (&local_ad0,&local_c8,1,0,WARN,(check_type)ppcVar11,(size_t)&local_b20,0x638);
  boost::detail::shared_count::~shared_count(&local_ad0.m_message.pn);
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b28 = "";
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_48.m_end = pvVar5;
  msg_48.m_begin = pvVar4;
  file_48.m_end = (iterator)0x639;
  file_48.m_begin = (iterator)&local_b30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_b40,
             msg_48);
  local_ad0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pTVar2[2].origin == &t2);
  local_ad0.m_message.px = (element_type *)0x0;
  local_ad0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_ae0 = "v8[2].origin == &t2";
  local_ad8 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b48 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)&local_ae0;
  boost::test_tools::tt_detail::report_assertion
            (&local_ad0,&local_c8,1,0,WARN,(check_type)ppcVar11,(size_t)&local_b50,0x639);
  boost::detail::shared_count::~shared_count(&local_ad0.m_message.pn);
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b58 = "";
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_49.m_end = pvVar5;
  msg_49.m_begin = pvVar4;
  file_49.m_end = (iterator)0x63a;
  file_49.m_begin = (iterator)&local_b60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_b70,
             msg_49);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b78 = "";
  piVar7 = &pTVar2->copies;
  local_ad0._0_8_ = local_ad0._0_8_ & 0xffffffff00000000;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_b80,0x63a,1,2,piVar7,"v8[0].copies",&local_ad0,"0");
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b88 = "";
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_50.m_end = (iterator)piVar7;
  msg_50.m_begin = pvVar4;
  file_50.m_end = (iterator)0x63b;
  file_50.m_begin = (iterator)&local_b90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_ba0,
             msg_50);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_bb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ba8 = "";
  piVar7 = &pTVar2[1].copies;
  local_ad0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_ad0._1_3_ = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_bb0,0x63b,1,2,piVar7,"v8[1].copies",&local_ad0,"1");
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_bb8 = "";
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_51.m_end = (iterator)piVar7;
  msg_51.m_begin = pvVar4;
  file_51.m_end = (iterator)0x63c;
  file_51.m_begin = (iterator)&local_bc0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_bd0,
             msg_51);
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)0xc694e1;
  local_be0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_bd8 = "";
  local_ad0._0_8_ = (ulong)(uint)local_ad0._4_4_ << 0x20;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_c8,&local_be0,0x63c,1,2,&pTVar2[2].copies,"v8[2].copies",&local_ad0,"0");
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v8.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v7.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v6.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v5.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v4.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v3.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v2.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  std::
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::~_Vector_base(&v1.
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_tracked_vector)
{
    Tracker t1;
    Tracker t2;
    Tracker t3;

    BOOST_CHECK(t1.origin == &t1);
    BOOST_CHECK(t2.origin == &t2);
    BOOST_CHECK(t3.origin == &t3);

    auto v1 = Vector(t1);
    BOOST_CHECK_EQUAL(v1.size(), 1U);
    BOOST_CHECK(v1[0].origin == &t1);
    BOOST_CHECK_EQUAL(v1[0].copies, 1);

    auto v2 = Vector(std::move(t2));
    BOOST_CHECK_EQUAL(v2.size(), 1U);
    BOOST_CHECK(v2[0].origin == &t2); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v2[0].copies, 0);

    auto v3 = Vector(t1, std::move(t2));
    BOOST_CHECK_EQUAL(v3.size(), 2U);
    BOOST_CHECK(v3[0].origin == &t1);
    BOOST_CHECK(v3[1].origin == &t2); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v3[0].copies, 1);
    BOOST_CHECK_EQUAL(v3[1].copies, 0);

    auto v4 = Vector(std::move(v3[0]), v3[1], std::move(t3));
    BOOST_CHECK_EQUAL(v4.size(), 3U);
    BOOST_CHECK(v4[0].origin == &t1);
    BOOST_CHECK(v4[1].origin == &t2);
    BOOST_CHECK(v4[2].origin == &t3); // NOLINT(*-use-after-move)
    BOOST_CHECK_EQUAL(v4[0].copies, 1);
    BOOST_CHECK_EQUAL(v4[1].copies, 1);
    BOOST_CHECK_EQUAL(v4[2].copies, 0);

    auto v5 = Cat(v1, v4);
    BOOST_CHECK_EQUAL(v5.size(), 4U);
    BOOST_CHECK(v5[0].origin == &t1);
    BOOST_CHECK(v5[1].origin == &t1);
    BOOST_CHECK(v5[2].origin == &t2);
    BOOST_CHECK(v5[3].origin == &t3);
    BOOST_CHECK_EQUAL(v5[0].copies, 2);
    BOOST_CHECK_EQUAL(v5[1].copies, 2);
    BOOST_CHECK_EQUAL(v5[2].copies, 2);
    BOOST_CHECK_EQUAL(v5[3].copies, 1);

    auto v6 = Cat(std::move(v1), v3);
    BOOST_CHECK_EQUAL(v6.size(), 3U);
    BOOST_CHECK(v6[0].origin == &t1);
    BOOST_CHECK(v6[1].origin == &t1);
    BOOST_CHECK(v6[2].origin == &t2);
    BOOST_CHECK_EQUAL(v6[0].copies, 1);
    BOOST_CHECK_EQUAL(v6[1].copies, 2);
    BOOST_CHECK_EQUAL(v6[2].copies, 1);

    auto v7 = Cat(v2, std::move(v4));
    BOOST_CHECK_EQUAL(v7.size(), 4U);
    BOOST_CHECK(v7[0].origin == &t2);
    BOOST_CHECK(v7[1].origin == &t1);
    BOOST_CHECK(v7[2].origin == &t2);
    BOOST_CHECK(v7[3].origin == &t3);
    BOOST_CHECK_EQUAL(v7[0].copies, 1);
    BOOST_CHECK_EQUAL(v7[1].copies, 1);
    BOOST_CHECK_EQUAL(v7[2].copies, 1);
    BOOST_CHECK_EQUAL(v7[3].copies, 0);

    auto v8 = Cat(std::move(v2), std::move(v3));
    BOOST_CHECK_EQUAL(v8.size(), 3U);
    BOOST_CHECK(v8[0].origin == &t2);
    BOOST_CHECK(v8[1].origin == &t1);
    BOOST_CHECK(v8[2].origin == &t2);
    BOOST_CHECK_EQUAL(v8[0].copies, 0);
    BOOST_CHECK_EQUAL(v8[1].copies, 1);
    BOOST_CHECK_EQUAL(v8[2].copies, 0);
}